

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O0

void __thiscall
gl4cts::TextureFilterMinmaxUtils::SupportedTextureType::renderQuad
          (SupportedTextureType *this,RenderContext *context,GLint reductionMode)

{
  void **__return_storage_ptr__;
  GLenum GVar1;
  code *pcVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 uVar7;
  undefined4 extraout_var;
  float *data;
  TestError *this_00;
  VertexArrayBinding *local_3e8;
  PrimitiveList local_338;
  ProgramSources local_320;
  undefined1 local_250 [8];
  ShaderProgram program;
  string local_178;
  allocator<char> local_141;
  string local_140;
  void **local_120;
  undefined1 local_118 [8];
  VertexArrayBinding vertexArrays [2];
  undefined1 local_70 [8];
  vector<float,_std::allocator<float>_> texCoords;
  float position [8];
  deUint16 quadIndices [6];
  Functions *gl;
  GLint reductionMode_local;
  RenderContext *context_local;
  SupportedTextureType *this_local;
  long lVar8;
  
  iVar5 = (*context->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar5);
  position[6] = 9.18355e-41;
  position[7] = 1.83674e-40;
  position[2] = 1.0;
  position[3] = -1.0;
  position[4] = 1.0;
  position[5] = 1.0;
  texCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0xbf800000;
  texCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0xbf800000;
  position[0] = -1.0;
  position[1] = 1.0;
  (*this->_vptr_SupportedTextureType[1])(local_70);
  program.m_program.m_info.linkTimeUs._6_1_ = 1;
  local_120 = (void **)local_118;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"position",&local_141);
  glu::va::Float((VertexArrayBinding *)local_118,&local_140,2,4,0,
                 (float *)&texCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
  __return_storage_ptr__ = &vertexArrays[0].pointer.data;
  local_120 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"inTexcoord",
             (allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 7));
  data = std::vector<float,_std::allocator<float>_>::data
                   ((vector<float,_std::allocator<float>_> *)local_70);
  glu::va::Float((VertexArrayBinding *)__return_storage_ptr__,&local_178,1,4,0,data);
  program.m_program.m_info.linkTimeUs._6_1_ = 0;
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 7));
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  pcVar2 = *(code **)(lVar8 + 0xb8);
  GVar1 = this->m_type;
  iVar5 = (**this->_vptr_SupportedTextureType)();
  (*pcVar2)(GVar1,iVar5);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0xb1);
  (**(code **)(lVar8 + 0x1360))(this->m_type,0x2800,0x2601);
  (**(code **)(lVar8 + 0x1360))(this->m_type,0x2801,0x2601);
  (**(code **)(lVar8 + 0x1360))(this->m_type,0x9366,reductionMode);
  glu::makeVtxFragSources(&local_320,&this->m_vertexShader,&this->m_fragmentShader);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_250,context,&local_320);
  glu::ProgramSources::~ProgramSources(&local_320);
  bVar4 = glu::ShaderProgram::isOk((ShaderProgram *)local_250);
  if (!bVar4) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
               ,0xba);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pcVar2 = *(code **)(lVar8 + 0x1680);
  dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_250);
  (*pcVar2)(dVar6);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glUseProgram failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0xbe);
  pcVar2 = *(code **)(lVar8 + 0x14f0);
  pcVar3 = *(code **)(lVar8 + 0xb48);
  dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_250);
  uVar7 = (*pcVar3)(dVar6,"sampler");
  (*pcVar2)(uVar7,0);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glUniform1i failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0xc1);
  (**(code **)(lVar8 + 0x188))(0x4000);
  dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_250);
  glu::pr::TriangleStrip(&local_338,6,(deUint16 *)(position + 6));
  glu::draw(context,dVar6,2,(VertexArrayBinding *)local_118,&local_338,(DrawUtilCallback *)0x0);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_250);
  local_3e8 = (VertexArrayBinding *)&vertexArrays[1].pointer.data;
  do {
    local_3e8 = local_3e8 + -1;
    glu::VertexArrayBinding::~VertexArrayBinding(local_3e8);
  } while (local_3e8 != (VertexArrayBinding *)local_118);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_70);
  return;
}

Assistant:

void TextureFilterMinmaxUtils::SupportedTextureType::renderQuad(const glu::RenderContext& context,
																glw::GLint				  reductionMode)
{
	const glw::Functions& gl = context.getFunctions();

	deUint16 const quadIndices[] = { 0, 1, 2, 2, 1, 3 };

	float const position[] = { -1.0f, -1.0f, -1.0f, 1.0f, 1.0f, -1.0f, 1.0f, 1.0f };

	std::vector<float> texCoords = getTexCoords();

	glu::VertexArrayBinding vertexArrays[] = { glu::va::Float("position", 2, 4, 0, position),
											   glu::va::Float("inTexcoord", 1, 4, 0, texCoords.data()) };

	gl.bindTexture(m_type, this->getTextureGL());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

	gl.texParameteri(m_type, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
	gl.texParameteri(m_type, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
	gl.texParameteri(m_type, GL_TEXTURE_REDUCTION_MODE_ARB, reductionMode);

	glu::ShaderProgram program(context, glu::makeVtxFragSources(m_vertexShader, m_fragmentShader));
	if (!program.isOk())
	{
		TCU_FAIL("Shader compilation failed");
	}

	gl.useProgram(program.getProgram());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram failed");

	gl.uniform1i(gl.getUniformLocation(program.getProgram(), "sampler"), 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i failed");

	gl.clear(GL_COLOR_BUFFER_BIT);

	glu::draw(context, program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), vertexArrays,
			  glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(quadIndices), quadIndices));
}